

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O2

JSONNode __thiscall ser::CentralizedFileFormat::GlobalInfoToJSON(CentralizedFileFormat *this)

{
  long in_RSI;
  _Alloc_hider child;
  allocator local_39;
  json_string local_38;
  
  ::JSONNode::JSONNode((JSONNode *)this,'\x05');
  std::__cxx11::string::string((string *)&local_38,"GlobalMetainfo",&local_39);
  ::JSONNode::set_name((JSONNode *)this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  MetainfoSet::GenerateNodes
            ((vector<JSONNode,_std::allocator<JSONNode>_> *)&local_38,
             *(MetainfoSet **)(in_RSI + 0x58));
  for (child._M_p = local_38._M_dataplus._M_p; child._M_p != (pointer)local_38._M_string_length;
      child._M_p = child._M_p + 8) {
    ::JSONNode::push_back((JSONNode *)this,(JSONNode *)child._M_p);
  }
  std::vector<JSONNode,_std::allocator<JSONNode>_>::~vector
            ((vector<JSONNode,_std::allocator<JSONNode>_> *)&local_38);
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode CentralizedFileFormat::GlobalInfoToJSON() const
{
    JSONNode node;
    node.set_name("GlobalMetainfo");

    const std::vector<JSONNode>& nodes = pGlobalMetainfo_->GenerateNodes();
    for (std::vector<JSONNode>::const_iterator iter = nodes.begin(); iter != nodes.end(); ++iter)
        node.push_back(*iter);

    return node;
}